

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_coroutine.hpp
# Opt level: O2

int __thiscall squall::Coroutine::result<int>(Coroutine *this)

{
  int iVar1;
  RestoreStack r;
  RestoreStack local_18;
  
  validate_vm(this);
  local_18.top_ = this->top_;
  local_18.vm_ = &this->vm_;
  iVar1 = detail::call_teardown<int>(this->vm_);
  RestoreStack::~RestoreStack(&local_18);
  return iVar1;
}

Assistant:

R result() {
        validate_vm();
        RestoreStack r(vm_, top_);
        return detail::call_teardown<R>(vm_);
    }